

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O3

void __thiscall Nes_Apu::write_register(Nes_Apu *this,nes_time_t time,nes_addr_t addr,int data)

{
  Nes_Osc *pNVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint addr_00;
  bool bVar6;
  
  uVar2 = addr - 0x4000;
  if (uVar2 < 0x18) {
    run_until_(this,time);
    if (0x4013 < addr) {
      if (addr == 0x4017) {
        this->frame_mode = data;
        this->irq_flag = (bool)(this->irq_flag & ~(byte)((uint)data >> 6));
        this->next_irq = 0x40000000;
        uVar2 = this->frame_delay & 1;
        this->frame_delay = uVar2;
        this->frame = 0;
        if (-1 < (char)(uchar)data) {
          iVar3 = uVar2 + this->frame_period;
          this->frame = 1;
          this->frame_delay = iVar3;
          if ((data & 0x40U) == 0) {
            this->next_irq = time + iVar3 + this->frame_period * 3 + 1;
          }
        }
      }
      else {
        if (addr != 0x4015) {
          return;
        }
        lVar4 = 4;
        do {
          if (((uint)data >> ((uint)lVar4 & 0x1f) & 1) == 0) {
            this->oscs[lVar4]->length_counter = 0;
          }
          bVar6 = lVar4 != 0;
          lVar4 = lVar4 + -1;
        } while (bVar6);
        bVar6 = (this->dmc).irq_flag;
        (this->dmc).irq_flag = false;
        uVar2 = this->osc_enables;
        this->osc_enables = data;
        if ((data & 0x10U) == 0) {
          (this->dmc).next_irq = 0x40000000;
        }
        else {
          if ((uVar2 & 0x10) == 0) {
            Nes_Dmc::start(&this->dmc);
          }
          if (bVar6 == false) {
            return;
          }
        }
      }
      irq_changed(this);
      return;
    }
    uVar5 = uVar2 >> 2;
    pNVar1 = this->oscs[uVar5];
    addr_00 = addr & 3;
    pNVar1->regs[addr_00] = (uchar)data;
    pNVar1->reg_written[addr_00] = true;
    if (uVar5 == 4) {
      Nes_Dmc::write_register(&this->dmc,addr_00,data);
      return;
    }
    if (addr_00 == 3) {
      if (((uint)this->osc_enables >> (uVar5 & 0x1f) & 1) != 0) {
        pNVar1->length_counter = (uint)length_table[(uint)data >> 3 & 0x1f];
      }
      if (uVar2 < 8) {
        *(undefined4 *)&pNVar1[1].output = 7;
      }
    }
  }
  return;
}

Assistant:

void Nes_Apu::write_register( nes_time_t time, nes_addr_t addr, int data )
{
	require( addr > 0x20 ); // addr must be actual address (i.e. 0x40xx)
	require( (unsigned) data <= 0xFF );
	
	// Ignore addresses outside range
	if ( unsigned (addr - start_addr) > end_addr - start_addr )
		return;
	
	run_until_( time );
	
	if ( addr < 0x4014 )
	{
		// Write to channel
		int osc_index = (addr - start_addr) >> 2;
		Nes_Osc* osc = oscs [osc_index];
		
		int reg = addr & 3;
		osc->regs [reg] = data;
		osc->reg_written [reg] = true;
		
		if ( osc_index == 4 )
		{
			// handle DMC specially
			dmc.write_register( reg, data );
		}
		else if ( reg == 3 )
		{
			// load length counter
			if ( (osc_enables >> osc_index) & 1 )
				osc->length_counter = length_table [(data >> 3) & 0x1F];
			
			// reset square phase
			if ( osc_index < 2 )
				((Nes_Square*) osc)->phase = Nes_Square::phase_range - 1;
		}
	}
	else if ( addr == 0x4015 )
	{
		// Channel enables
		for ( int i = osc_count; i--; )
			if ( !((data >> i) & 1) )
				oscs [i]->length_counter = 0;
		
		bool recalc_irq = dmc.irq_flag;
		dmc.irq_flag = false;
		
		int old_enables = osc_enables;
		osc_enables = data;
		if ( !(data & 0x10) ) {
			dmc.next_irq = no_irq;
			recalc_irq = true;
		}
		else if ( !(old_enables & 0x10) ) {
			dmc.start(); // dmc just enabled
		}
		
		if ( recalc_irq )
			irq_changed();
	}
	else if ( addr == 0x4017 )
	{
		// Frame mode
		frame_mode = data;
		
		bool irq_enabled = !(data & 0x40);
		irq_flag &= irq_enabled;
		next_irq = no_irq;
		
		// mode 1
		frame_delay = (frame_delay & 1);
		frame = 0;
		
		if ( !(data & 0x80) )
		{
			// mode 0
			frame = 1;
			frame_delay += frame_period;
			if ( irq_enabled )
				next_irq = time + frame_delay + frame_period * 3 + 1;
		}
		
		irq_changed();
	}
}